

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O2

ngx_int_t ngx_parse_time(ngx_str_t *line,ngx_uint_t is_sec)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte bVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  bVar7 = (is_sec == 0) * '\x02';
  pbVar4 = line->data;
  pbVar6 = pbVar4 + line->len;
  lVar3 = 0;
  bVar1 = false;
  do {
    lVar9 = 0;
    pbVar5 = pbVar4;
    while( true ) {
      pbVar4 = pbVar5 + 1;
      if (pbVar6 <= pbVar5) {
        if (!bVar1) {
          return -1;
        }
        if (is_sec == 0) {
          if (0x20c49ba5e353f7 < lVar9) {
            return -1;
          }
          lVar9 = lVar9 * 1000;
        }
        if (0x7fffffffffffffff - lVar9 < lVar3) {
          return -1;
        }
        return lVar9 + lVar3;
      }
      bVar8 = *pbVar5;
      if (9 < (byte)(bVar8 - 0x30)) break;
      if (0xccccccccccccccb < lVar9) {
        if (lVar9 != 0xccccccccccccccc) {
          return -1;
        }
        if ((bVar8 & 8) != 0) {
          return -1;
        }
      }
      lVar9 = lVar9 * 10 + (ulong)bVar8 + -0x30;
      pbVar5 = pbVar4;
      bVar1 = true;
    }
    if ((ulong)bVar8 == 0x20) {
      bVar8 = 9;
joined_r0x00117fce:
      bVar11 = 6 < bVar7;
      uVar2 = 0x7fffffffffffffff;
      lVar10 = 1;
      bVar7 = bVar8;
      if (bVar11) {
        return -1;
      }
LAB_0011805d:
      if (is_sec == 0) {
        lVar10 = lVar10 * 1000;
        uVar2 = uVar2 / 1000;
      }
    }
    else {
      if (bVar8 == 0x4d) {
        lVar10 = 0x278d00;
        uVar2 = 0x33c812681e8;
        bVar11 = 1 < bVar7;
        bVar7 = 2;
        if (bVar11) {
          return -1;
        }
        goto LAB_0011805d;
      }
      if (bVar8 == 100) {
        lVar10 = 0x15180;
        uVar2 = 0x611722833944;
        bVar11 = 3 < bVar7;
        bVar7 = 4;
        if (bVar11) {
          return -1;
        }
        goto LAB_0011805d;
      }
      if (bVar8 == 0x68) {
        lVar10 = 0xe10;
        uVar2 = 0x91a2b3c4d5e6f;
        bVar11 = 4 < bVar7;
        bVar7 = 5;
        if (bVar11) {
          return -1;
        }
        goto LAB_0011805d;
      }
      if (bVar8 != 0x6d) {
        if (bVar8 == 0x73) {
          bVar8 = 7;
          goto joined_r0x00117fce;
        }
        if (bVar8 == 0x77) {
          lVar10 = 0x93a80;
          uVar2 = 0xddebbc99a77;
          bVar11 = 2 < bVar7;
          bVar7 = 3;
          if (bVar11) {
            return -1;
          }
        }
        else {
          if (bVar8 != 0x79) {
            return -1;
          }
          lVar10 = 0x1e13380;
          uVar2 = 0x4418a47ae5;
          bVar11 = bVar7 != 0;
          bVar7 = 1;
          if (bVar11) {
            return -1;
          }
        }
        goto LAB_0011805d;
      }
      if ((pbVar6 <= pbVar4) || (*pbVar4 != 0x73)) {
        lVar10 = 0x3c;
        uVar2 = 0x222222222222222;
        bVar11 = 5 < bVar7;
        bVar7 = 6;
        if (bVar11) {
          return -1;
        }
        goto LAB_0011805d;
      }
      if ((is_sec != 0) || (7 < bVar7)) {
        return -1;
      }
      pbVar4 = pbVar5 + 2;
      bVar7 = 8;
      lVar10 = 1;
      uVar2 = 0x7fffffffffffffff;
    }
    if ((long)uVar2 < lVar9) {
      return -1;
    }
    if (0x7fffffffffffffff - lVar10 * lVar9 < lVar3) {
      return -1;
    }
    lVar3 = lVar3 + lVar10 * lVar9;
    for (; (pbVar4 < pbVar6 && (*pbVar4 == 0x20)); pbVar4 = pbVar4 + 1) {
    }
  } while( true );
}

Assistant:

ngx_int_t
ngx_parse_time(ngx_str_t *line, ngx_uint_t is_sec)
{
    u_char      *p, *last;
    ngx_int_t    value, total, scale;
    ngx_int_t    max, cutoff, cutlim;
    ngx_uint_t   valid;
    enum {
        st_start = 0,
        st_year,
        st_month,
        st_week,
        st_day,
        st_hour,
        st_min,
        st_sec,
        st_msec,
        st_last
    } step;

    valid = 0;
    value = 0;
    total = 0;
    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;
    step = is_sec ? st_start : st_month;

    p = line->data;
    last = p + line->len;

    while (p < last) {

        if (*p >= '0' && *p <= '9') {
            if (value >= cutoff && (value > cutoff || *p - '0' > cutlim)) {
                return NGX_ERROR;
            }

            value = value * 10 + (*p++ - '0');
            valid = 1;
            continue;
        }

        switch (*p++) {

        case 'y':
            if (step > st_start) {
                return NGX_ERROR;
            }
            step = st_year;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 365);
            scale = 60 * 60 * 24 * 365;
            break;

        case 'M':
            if (step >= st_month) {
                return NGX_ERROR;
            }
            step = st_month;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 30);
            scale = 60 * 60 * 24 * 30;
            break;

        case 'w':
            if (step >= st_week) {
                return NGX_ERROR;
            }
            step = st_week;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 7);
            scale = 60 * 60 * 24 * 7;
            break;

        case 'd':
            if (step >= st_day) {
                return NGX_ERROR;
            }
            step = st_day;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24);
            scale = 60 * 60 * 24;
            break;

        case 'h':
            if (step >= st_hour) {
                return NGX_ERROR;
            }
            step = st_hour;
            max = NGX_MAX_INT_T_VALUE / (60 * 60);
            scale = 60 * 60;
            break;

        case 'm':
            if (p < last && *p == 's') {
                if (is_sec || step >= st_msec) {
                    return NGX_ERROR;
                }
                p++;
                step = st_msec;
                max = NGX_MAX_INT_T_VALUE;
                scale = 1;
                break;
            }

            if (step >= st_min) {
                return NGX_ERROR;
            }
            step = st_min;
            max = NGX_MAX_INT_T_VALUE / 60;
            scale = 60;
            break;

        case 's':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_sec;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        case ' ':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_last;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        default:
            return NGX_ERROR;
        }

        if (step != st_msec && !is_sec) {
            scale *= 1000;
            max /= 1000;
        }

        if (value > max) {
            return NGX_ERROR;
        }

        value *= scale;

        if (total > NGX_MAX_INT_T_VALUE - value) {
            return NGX_ERROR;
        }

        total += value;

        value = 0;

        while (p < last && *p == ' ') {
            p++;
        }
    }

    if (!valid) {
        return NGX_ERROR;
    }

    if (!is_sec) {
        if (value > NGX_MAX_INT_T_VALUE / 1000) {
            return NGX_ERROR;
        }

        value *= 1000;
    }

    if (total > NGX_MAX_INT_T_VALUE - value) {
        return NGX_ERROR;
    }

    return total + value;
}